

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopMakeCubeFree(Kit_Sop_t *cSop)

{
  uint uMask_00;
  int iVar1;
  uint uCube_00;
  bool bVar2;
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  uint uCube;
  uint uMask;
  Kit_Sop_t *cSop_local;
  
  uMask_00 = Kit_SopCommonCube(cSop);
  if (uMask_00 != 0) {
    local_1c = 0;
    while( true ) {
      iVar1 = Kit_SopCubeNum(cSop);
      bVar2 = false;
      if (local_1c < iVar1) {
        local_18 = Kit_SopCube(cSop,local_1c);
        bVar2 = local_18 != 0;
      }
      if (!bVar2) break;
      uCube_00 = Kit_CubeSharp(local_18,uMask_00);
      Kit_SopWriteCube(cSop,uCube_00,local_1c);
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void Kit_SopMakeCubeFree( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = Kit_SopCommonCube( cSop );
    if ( uMask == 0 )
        return;
    // remove the common cube
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopWriteCube( cSop, Kit_CubeSharp(uCube, uMask), i );
}